

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutAlsa::initialize(MidiOutAlsa *this,string *clientName)

{
  pointer pcVar1;
  int iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  _Alloc_hider _Var5;
  snd_seq_t *seq;
  undefined8 local_80;
  string local_78;
  string local_58;
  string local_38;
  
  iVar2 = snd_seq_open(&local_80,"default",1,1);
  if (iVar2 < 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
               (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,0x110d15
              );
    pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,
               pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
    MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_38);
    _Var5._M_p = local_38._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return;
    }
  }
  else {
    snd_seq_set_client_name(local_80,(clientName->_M_dataplus)._M_p);
    puVar3 = (undefined8 *)operator_new(0x58);
    *puVar3 = local_80;
    puVar3[1] = 0xffffffffffffffff;
    *(undefined4 *)(puVar3 + 4) = 0x20;
    puVar3[3] = 0;
    puVar3[5] = 0;
    iVar2 = snd_midi_event_new(0x20,puVar3 + 3);
    if (iVar2 < 0) {
      operator_delete(puVar3,0x58);
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x110d5b);
      pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar1,
                 pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_58);
      local_38.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
      _Var5._M_p = local_58._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return;
      }
    }
    else {
      pvVar4 = malloc((ulong)*(uint *)(puVar3 + 4));
      puVar3[5] = pvVar4;
      if (pvVar4 != (void *)0x0) {
        snd_midi_event_init(puVar3[3]);
        (this->super_MidiOutApi).super_MidiApi.apiData_ = puVar3;
        return;
      }
      operator_delete(puVar3,0x58);
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x110d9c);
      pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,
                 pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_78);
      local_38.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      _Var5._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return;
      }
    }
  }
  operator_delete(_Var5._M_p,local_38.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void MidiOutAlsa :: initialize( const std::string& clientName )
{
  // Set up the ALSA sequencer client.
  snd_seq_t *seq;
  int result1 = snd_seq_open( &seq, "default", SND_SEQ_OPEN_OUTPUT, SND_SEQ_NONBLOCK );
  if ( result1 < 0 ) {
    errorString_ = "MidiOutAlsa::initialize: error creating ALSA sequencer client object.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Set client name.
  snd_seq_set_client_name( seq, clientName.c_str() );

  // Save our api-specific connection information.
  AlsaMidiData *data = (AlsaMidiData *) new AlsaMidiData;
  data->seq = seq;
  data->portNum = -1;
  data->vport = -1;
  data->bufferSize = 32;
  data->coder = 0;
  data->buffer = 0;
  int result = snd_midi_event_new( data->bufferSize, &data->coder );
  if ( result < 0 ) {
    delete data;
    errorString_ = "MidiOutAlsa::initialize: error initializing MIDI event parser!\n\n";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }
  data->buffer = (unsigned char *) malloc( data->bufferSize );
  if ( data->buffer == NULL ) {
    delete data;
    errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
    error( RtMidiError::MEMORY_ERROR, errorString_ );
    return;
  }
  snd_midi_event_init( data->coder );
  apiData_ = (void *) data;
}